

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O3

Opnd * __thiscall
Lowerer::LoadSlotArrayWithCachedProtoType
          (Lowerer *this,Instr *instrInsert,PropertySymOpnd *propertySymOpnd)

{
  code *pcVar1;
  bool bVar2;
  DWORD DVar3;
  intptr_t pMemLoc;
  undefined4 *puVar4;
  RegOpnd *dst;
  MemRefOpnd *pMVar5;
  
  pMemLoc = IR::PropertySymOpnd::GetProtoObject(propertySymOpnd);
  if (pMemLoc == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x6f22,"(prototypeObject != 0)","prototypeObject != 0");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  if (((propertySymOpnd->field_0x61 & 1) != 0) &&
     (propertySymOpnd->objTypeSpecFldInfo != (ObjTypeSpecFldInfo *)0x0)) {
    dst = IR::RegOpnd::New(TyInt64,this->m_func);
    DVar3 = Js::DynamicObject::GetOffsetOfAuxSlots();
    pMVar5 = IR::MemRefOpnd::New((void *)(pMemLoc + (ulong)DVar3),TyInt64,this->m_func,
                                 AddrOpndKindDynamicAuxSlotArrayRef);
    InsertMove(&dst->super_Opnd,&pMVar5->super_Opnd,instrInsert,true);
    return &dst->super_Opnd;
  }
  pMVar5 = IR::MemRefOpnd::New(pMemLoc,TyInt64,this->m_func,AddrOpndKindDynamicMisc);
  return &pMVar5->super_Opnd;
}

Assistant:

IR::Opnd *
Lowerer::LoadSlotArrayWithCachedProtoType(IR::Instr * instrInsert, IR::PropertySymOpnd *propertySymOpnd)
{
    // Get the prototype object from the cache
    intptr_t prototypeObject = propertySymOpnd->GetProtoObject();
    Assert(prototypeObject != 0);

    if (propertySymOpnd->UsesAuxSlot())
    {
        // If we use the auxiliary slot array, load it from the prototype object and return it
        IR::RegOpnd *opndSlotArray = IR::RegOpnd::New(TyMachReg, this->m_func);
        IR::Opnd *opnd = IR::MemRefOpnd::New((char*)prototypeObject + Js::DynamicObject::GetOffsetOfAuxSlots(), TyMachReg, this->m_func, IR::AddrOpndKindDynamicAuxSlotArrayRef);
        Lowerer::InsertMove(opndSlotArray, opnd, instrInsert);
        return opndSlotArray;
    }
    else
    {
        // If we use inline slot return the address of the prototype object
        return IR::MemRefOpnd::New(prototypeObject, TyMachReg, this->m_func);
    }
}